

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

HeapAndPointer __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::getHeapAndAdjustedPointer(unsigned_int,wasm::Expression__unsigned_int_
          (void *this,Index bytes,Expression *ptr,Index offset)

{
  HeapAndPointer HVar1;
  Ref RVar2;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar3;
  IString name;
  Address local_58;
  Ref local_50;
  Ref adjustedPtr;
  IString heap;
  Index offset_local;
  Expression *ptr_local;
  Index bytes_local;
  ExpressionProcessor *this_local;
  
  IString::IString((IString *)&adjustedPtr);
  Address::Address(&local_58,(ulong)offset);
  local_50 = makePointer(wasm::Expression*,wasm::Address_(this,ptr,local_58);
  if (bytes == 1) {
    IString::operator=((IString *)&adjustedPtr,(IString *)&cashew::HEAP8);
    pcVar3 = extraout_RDX;
  }
  else if (bytes == 2) {
    IString::operator=((IString *)&adjustedPtr,(IString *)&cashew::HEAP16);
    local_50 = cashew::ValueBuilder::makePtrShift(local_50,1);
    pcVar3 = extraout_RDX_00;
  }
  else {
    if (bytes != 4) {
      ::wasm::handle_unreachable
                ("unimp",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                 ,0x811);
    }
    IString::operator=((IString *)&adjustedPtr,(IString *)&cashew::HEAP32);
    local_50 = cashew::ValueBuilder::makePtrShift(local_50,2);
    pcVar3 = extraout_RDX_01;
  }
  name.str._M_str = pcVar3;
  name.str._M_len = heap.str._M_len;
  RVar2 = cashew::ValueBuilder::makeName(adjustedPtr.inst,name);
  HVar1.ptr.inst = local_50.inst;
  HVar1.heap.inst = RVar2.inst;
  return HVar1;
}

Assistant:

HeapAndPointer
    getHeapAndAdjustedPointer(Index bytes, Expression* ptr, Index offset) {
      IString heap;
      Ref adjustedPtr = makePointer(ptr, offset);
      switch (bytes) {
        case 1:
          heap = HEAP8;
          break;
        case 2:
          heap = HEAP16;
          adjustedPtr = ValueBuilder::makePtrShift(adjustedPtr, 1);
          break;
        case 4:
          heap = HEAP32;
          adjustedPtr = ValueBuilder::makePtrShift(adjustedPtr, 2);
          break;
        default: {
          WASM_UNREACHABLE("unimp");
        }
      }
      return {ValueBuilder::makeName(heap), adjustedPtr};
    }